

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

SIMPLE_MOTION_DATA_TREE * setup_sms_tree(AV1_COMP *cpi,SIMPLE_MOTION_DATA_TREE *sms_tree)

{
  BLOCK_SIZE BVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar6;
  SIMPLE_MOTION_DATA_TREE *tree_2;
  SIMPLE_MOTION_DATA_TREE *pSVar7;
  int iVar8;
  SIMPLE_MOTION_DATA_TREE *pSVar9;
  SIMPLE_MOTION_DATA_TREE *pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar5;
  
  if ((cpi->oxcf).pass != AOM_RC_FIRST_PASS) {
    BVar1 = ((cpi->common).seq_params)->sb_size;
    if (cpi->compressor_stage != '\x01') {
      uVar2 = (ulong)(BVar1 == BLOCK_128X128) << 10 | 0x155;
      uVar4 = 0x100;
      pSVar9 = sms_tree;
      uVar5 = uVar4;
      if (BVar1 == BLOCK_128X128) {
        uVar4 = 0x400;
        uVar5 = uVar4;
      }
      do {
        pSVar9->block_size = BLOCK_4X4;
        uVar4 = uVar4 - 1;
        pSVar9 = pSVar9 + 1;
      } while (uVar4 != 0);
      lVar6 = 1;
      uVar4 = uVar5;
      pSVar9 = sms_tree;
      do {
        uVar3 = (uint)uVar5;
        if (uVar3 < 4) break;
        uVar5 = uVar5 >> 2;
        BVar1 = square[lVar6];
        pSVar7 = sms_tree + uVar4;
        iVar8 = 0;
        pSVar10 = pSVar9;
        do {
          pSVar7->block_size = BVar1;
          pSVar9 = pSVar10 + 4;
          auVar11._8_4_ = (int)pSVar10;
          auVar11._0_8_ = pSVar10;
          auVar11._12_4_ = (int)((ulong)pSVar10 >> 0x20);
          pSVar7->split[0] = pSVar10;
          pSVar7->split[1] = (SIMPLE_MOTION_DATA_TREE *)(auVar11._8_8_ + 0x78);
          pSVar10 = pSVar10 + 2;
          auVar12._8_4_ = (int)pSVar10;
          auVar12._0_8_ = pSVar10;
          auVar12._12_4_ = (int)((ulong)pSVar10 >> 0x20);
          pSVar7->split[2] = pSVar10;
          pSVar7->split[3] = (SIMPLE_MOTION_DATA_TREE *)(auVar12._8_8_ + 0x78);
          pSVar7 = pSVar7 + 1;
          iVar8 = iVar8 + -1;
          pSVar10 = pSVar9;
        } while (-(int)uVar5 != iVar8);
        uVar4 = (ulong)(uint)((int)uVar4 - iVar8);
        lVar6 = lVar6 + 1;
      } while (0xf < uVar3);
      goto LAB_001fcff0;
    }
  }
  sms_tree->block_size = BLOCK_16X16;
  uVar2 = 1;
LAB_001fcff0:
  return sms_tree + (uVar2 - 1);
}

Assistant:

static SIMPLE_MOTION_DATA_TREE *setup_sms_tree(
    AV1_COMP *const cpi, SIMPLE_MOTION_DATA_TREE *sms_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  int sms_tree_index = 0;
  SIMPLE_MOTION_DATA_TREE *this_sms;
  int square_index = 1;
  int nodes;
  this_sms = &sms_tree[0];

  if (!stat_generation_stage) {
    const int leaf_factor = is_sb_size_128 ? 4 : 1;
    const int leaf_nodes = 256 * leaf_factor;

    // Sets up all the leaf nodes in the tree.
    for (sms_tree_index = 0; sms_tree_index < leaf_nodes; ++sms_tree_index) {
      SIMPLE_MOTION_DATA_TREE *const tree = &sms_tree[sms_tree_index];
      tree->block_size = square[0];
    }

    // Each node has 4 leaf nodes, fill each block_size level of the tree
    // from leafs to the root.
    for (nodes = leaf_nodes >> 2; nodes > 0; nodes >>= 2) {
      for (int i = 0; i < nodes; ++i) {
        SIMPLE_MOTION_DATA_TREE *const tree = &sms_tree[sms_tree_index];
        tree->block_size = square[square_index];
        for (int j = 0; j < 4; j++) tree->split[j] = this_sms++;
        ++sms_tree_index;
      }
      ++square_index;
    }
  } else {
    // Allocation for firstpass/LAP stage
    // TODO(Mufaddal): refactor square_index to use a common block_size macro
    // from firstpass.c
    SIMPLE_MOTION_DATA_TREE *const tree = &sms_tree[sms_tree_index];
    square_index = 2;
    tree->block_size = square[square_index];
  }

  // Set up the root node for the largest superblock size
  return &sms_tree[tree_nodes - 1];
}